

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O0

void xc_func_end(xc_func_type *func)

{
  xc_func_type *in_RDI;
  int ii;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  if (in_RDI->info->end != (_func_void_xc_func_type_ptr *)0x0) {
    (*in_RDI->info->end)(in_RDI);
  }
  if (0 < in_RDI->n_func_aux) {
    for (iVar1 = 0; iVar1 < in_RDI->n_func_aux; iVar1 = iVar1 + 1) {
      xc_func_end((xc_func_type *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
      libxc_free((void *)0x156ae0);
    }
    libxc_free((void *)0x156afb);
  }
  if (in_RDI->mix_coef != (double *)0x0) {
    libxc_free((void *)0x156b15);
  }
  if (in_RDI->ext_params != (double *)0x0) {
    libxc_free((void *)0x156b35);
  }
  if (in_RDI->params != (void *)0x0) {
    libxc_free((void *)0x156b55);
  }
  libxc_free((void *)0x156b62);
  xc_func_nullify(in_RDI);
  return;
}

Assistant:

void xc_func_end(xc_func_type *func)
{
  assert(func != NULL && func->info != NULL);

  /* call internal termination routine */
  if(func->info->end != NULL)
    func->info->end(func);

  /* terminate any auxiliary functional */
  if(func->n_func_aux > 0){
    int ii;

    for(ii=0; ii<func->n_func_aux; ii++){
      xc_func_end(func->func_aux[ii]);
      libxc_free(func->func_aux[ii]);
    }
    libxc_free(func->func_aux);
  }

  /* deallocate coefficients for mixed functionals */
  if(func->mix_coef != NULL)
    libxc_free(func->mix_coef);

  /* deallocate any used parameter */
  if(func->ext_params != NULL)
    libxc_free(func->ext_params);
  if(func->params != NULL)
    libxc_free(func->params);

  libxc_free((void *) func->info);

  xc_func_nullify(func);
}